

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlp_overlay.cpp
# Opt level: O2

bool __thiscall r_exec::HLPOverlay::scan_bwd_guards(HLPOverlay *this)

{
  byte bVar1;
  char cVar2;
  bool bVar3;
  ushort uVar4;
  uint16_t uVar5;
  undefined8 in_RAX;
  ulong uVar6;
  undefined4 uStack_38;
  Atom a;
  
  _uStack_38 = in_RAX;
  uVar4 = r_code::Atom::asIndex();
  bVar1 = r_code::Atom::getAtomCount();
  uVar6 = 1;
  do {
    if (uVar6 - bVar1 == 1) {
LAB_00188c3e:
      return bVar1 < uVar6;
    }
    _uStack_38 = CONCAT44(*(undefined4 *)
                           ((this->super_Overlay).code +
                           (ulong)((uint)uVar4 + (int)uVar6 & 0xffff) * 4),uStack_38);
    cVar2 = r_code::Atom::getDescriptor();
    if (cVar2 == -0x7c) {
      uVar5 = r_code::Atom::asIndex();
      bVar3 = scan_location(this,uVar5);
LAB_00188c23:
      if (bVar3 == false) {
        r_code::Atom::~Atom(&a);
        goto LAB_00188c3e;
      }
    }
    else if (cVar2 == -0x73) {
      uVar5 = r_code::Atom::asIndex();
      bVar3 = scan_location(this,uVar5);
      goto LAB_00188c23;
    }
    r_code::Atom::~Atom(&a);
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

bool HLPOverlay::scan_bwd_guards()
{
    uint16_t guard_set_index = code[HLP_BWD_GUARDS].asIndex();
    uint16_t guard_count = code[guard_set_index].getAtomCount();

    for (uint16_t i = 1; i <= guard_count; ++i) {
        uint16_t index = guard_set_index + i;
        Atom a = code[index];

        switch (a.getDescriptor()) {
        case Atom::I_PTR:
            if (!scan_location(a.asIndex())) {
                return false;
            }

            break;

        case Atom::ASSIGN_PTR:
            if (!scan_location(a.asIndex())) {
                return false;
            }

            break;
        }
    }

    return true;
}